

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

string * __thiscall
chaiscript::eval::Fun_Call_AST_Node::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,Fun_Call_AST_Node *this)

{
  pointer psVar1;
  int iVar2;
  pointer psVar3;
  bool bVar4;
  ostringstream oss;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  psVar1 = (this->super_AST_Node).children.
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = 0;
  for (psVar3 = (this->super_AST_Node).children.
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    (**((psVar3->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       _vptr_AST_Node)(local_1c8);
    std::operator<<((ostream *)local_1a8,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar4) {
      std::operator<<((ostream *)local_1a8,"(");
    }
  }
  std::operator<<((ostream *)local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE 
        {
          std::ostringstream oss;

          int count = 0;
          for (const auto &child : this->children) {
            oss << child->pretty_print();

            if (count == 0)
            {
              oss << "(";
            }
            ++count;
          }

          oss << ")";

          return oss.str();
        }